

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  float *pfVar1;
  undefined8 *puVar2;
  int *piVar3;
  int iVar4;
  ImDrawChannel *pIVar5;
  void *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImTextureID pvVar11;
  ImDrawChannel *__dest;
  long lVar12;
  void *pvVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  
  if ((this->_Current != 0) || (1 < this->_Count)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x5a4,"Split","ImGui ASSERT FAILED: %s",
                "_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
               );
  }
  iVar4 = (this->_Channels).Size;
  if (iVar4 < channels_count) {
    iVar18 = (this->_Channels).Capacity;
    if (iVar18 < channels_count) {
      if (iVar18 == 0) {
        iVar20 = 8;
      }
      else {
        iVar20 = iVar18 / 2 + iVar18;
      }
      if (iVar20 <= channels_count) {
        iVar20 = channels_count;
      }
      if (iVar18 < iVar20) {
        __dest = (ImDrawChannel *)ImGui::MemAlloc((long)iVar20 << 5);
        pIVar5 = (this->_Channels).Data;
        if (pIVar5 != (ImDrawChannel *)0x0) {
          memcpy(__dest,pIVar5,(long)(this->_Channels).Size << 5);
          ImGui::MemFree((this->_Channels).Data);
        }
        (this->_Channels).Data = __dest;
        (this->_Channels).Capacity = iVar20;
      }
    }
    (this->_Channels).Size = channels_count;
  }
  this->_Count = channels_count;
  if ((this->_Channels).Size < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
  }
  pIVar5 = (this->_Channels).Data;
  (pIVar5->_IdxBuffer).Size = 0;
  (pIVar5->_IdxBuffer).Capacity = 0;
  (pIVar5->_IdxBuffer).Data = (unsigned_short *)0x0;
  (pIVar5->_CmdBuffer).Size = 0;
  (pIVar5->_CmdBuffer).Capacity = 0;
  (pIVar5->_CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar19 = 1;
    lVar16 = 0x38;
    do {
      lVar12 = (long)(this->_Channels).Size;
      if ((long)uVar19 < (long)iVar4) {
        if (lVar12 <= (long)uVar19) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar5 = (this->_Channels).Data;
        iVar18 = *(int *)((long)pIVar5 + lVar16 + -0x14);
        if (iVar18 < 0) {
          uVar17 = iVar18 / 2 + iVar18;
          if ((int)uVar17 < 1) {
            uVar17 = 0;
          }
          pvVar13 = ImGui::MemAlloc((ulong)uVar17 * 0x38);
          pvVar6 = *(void **)((long)pIVar5 + lVar16 + -0x10);
          if (pvVar6 != (void *)0x0) {
            memcpy(pvVar13,pvVar6,(long)*(int *)((long)pIVar5 + lVar16 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar5 + lVar16 + -0x10));
          }
          *(void **)((long)pIVar5 + lVar16 + -0x10) = pvVar13;
          *(uint *)((long)pIVar5 + lVar16 + -0x14) = uVar17;
        }
        *(undefined4 *)((long)pIVar5 + lVar16 + -0x18) = 0;
        if ((long)(this->_Channels).Size <= (long)uVar19) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar5 = (this->_Channels).Data;
        iVar18 = *(int *)((long)pIVar5 + lVar16 + -4);
        if (iVar18 < 0) {
          iVar18 = iVar18 / 2 + iVar18;
          if (iVar18 < 1) {
            iVar18 = 0;
          }
          pvVar13 = ImGui::MemAlloc((ulong)(uint)(iVar18 * 2));
          pvVar6 = *(void **)((long)&(pIVar5->_CmdBuffer).Size + lVar16);
          if (pvVar6 != (void *)0x0) {
            memcpy(pvVar13,pvVar6,(long)*(int *)((long)pIVar5 + lVar16 + -8) * 2);
            ImGui::MemFree(*(void **)((long)&(pIVar5->_CmdBuffer).Size + lVar16));
          }
          *(void **)((long)&(pIVar5->_CmdBuffer).Size + lVar16) = pvVar13;
          *(int *)((long)pIVar5 + lVar16 + -4) = iVar18;
        }
        *(undefined4 *)((long)pIVar5 + lVar16 + -8) = 0;
      }
      else {
        if (lVar12 <= (long)uVar19) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar5 = (this->_Channels).Data;
        puVar2 = (undefined8 *)((long)pIVar5 + lVar16 + -8);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)pIVar5 + lVar16 + -0x18);
        *puVar2 = 0;
        puVar2[1] = 0;
      }
      if ((long)(this->_Channels).Size <= (long)uVar19) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      if (*(int *)((long)(this->_Channels).Data + lVar16 + -0x18) == 0) {
        fVar7 = (draw_list->_CmdHeader).ClipRect.x;
        fVar8 = (draw_list->_CmdHeader).ClipRect.y;
        fVar9 = (draw_list->_CmdHeader).ClipRect.z;
        fVar10 = (draw_list->_CmdHeader).ClipRect.w;
        pvVar11 = (draw_list->_CmdHeader).TextureId;
        uVar17 = (draw_list->_CmdHeader).VtxOffset;
        if ((long)(this->_Channels).Size <= (long)uVar19) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar5 = (this->_Channels).Data;
        iVar18 = *(int *)((long)pIVar5 + lVar16 + -0x18);
        iVar20 = *(int *)((long)pIVar5 + lVar16 + -0x14);
        if (iVar18 == iVar20) {
          if (iVar20 == 0) {
            iVar14 = 8;
          }
          else {
            iVar14 = iVar20 / 2 + iVar20;
          }
          iVar18 = iVar18 + 1;
          if (iVar18 < iVar14) {
            iVar18 = iVar14;
          }
          if (iVar20 < iVar18) {
            pvVar13 = ImGui::MemAlloc((long)iVar18 * 0x38);
            pvVar6 = *(void **)((long)pIVar5 + lVar16 + -0x10);
            if (pvVar6 != (void *)0x0) {
              memcpy(pvVar13,pvVar6,(long)*(int *)((long)pIVar5 + lVar16 + -0x18) * 0x38);
              ImGui::MemFree(*(void **)((long)pIVar5 + lVar16 + -0x10));
            }
            *(void **)((long)pIVar5 + lVar16 + -0x10) = pvVar13;
            *(int *)((long)pIVar5 + lVar16 + -0x14) = iVar18;
          }
        }
        lVar12 = *(long *)((long)pIVar5 + lVar16 + -0x10);
        lVar15 = (long)*(int *)((long)pIVar5 + lVar16 + -0x18) * 0x38;
        *(undefined8 *)(lVar12 + 0x30 + lVar15) = 0;
        puVar2 = (undefined8 *)(lVar12 + 0x20 + lVar15);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)(lVar12 + 0x10 + lVar15);
        *puVar2 = pvVar11;
        puVar2[1] = (ulong)uVar17;
        pfVar1 = (float *)(lVar12 + lVar15);
        *pfVar1 = fVar7;
        pfVar1[1] = fVar8;
        pfVar1[2] = fVar9;
        pfVar1[3] = fVar10;
        piVar3 = (int *)((long)pIVar5 + lVar16 + -0x18);
        *piVar3 = *piVar3 + 1;
      }
      uVar19 = uVar19 + 1;
      lVar16 = lVar16 + 0x20;
    } while ((uint)channels_count != uVar19);
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            ImDrawCmd_HeaderCopy(&draw_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}